

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.cpp
# Opt level: O1

void scale_interval(uint *I_start,uint *I_end,int *I_l,int *I_bar_l,int n_int,int scale)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  
  *I_start = 0;
  *I_end = 0;
  if (0 < n_int) {
    uVar3 = 1;
    do {
      dVar4 = floor((double)I_bar_l[uVar3] / (double)scale);
      I_bar_l[uVar3] = (int)dVar4;
      dVar4 = ceil((double)I_l[uVar3] / (double)scale);
      I_l[uVar3] = (int)dVar4;
      uVar1 = I_end[uVar3 - 1];
      iVar2 = I_bar_l[uVar3];
      I_start[uVar3] = uVar1 + iVar2;
      I_end[uVar3] = uVar1 + iVar2 + I_l[uVar3];
      uVar3 = uVar3 + 1;
    } while (n_int + 1 != uVar3);
  }
  return;
}

Assistant:

void scale_interval(unsigned int* I_start, unsigned int* I_end, int* I_l, int* I_bar_l, int n_int, int scale)
{
    I_start[0] = 0;
    I_end[0] = 0;

    for(int i=1; i<=n_int; i++)
    {
        I_bar_l[i] = floor(double(I_bar_l[i]) / scale);
        I_l[i] = ceil(double(I_l[i]) / scale);
        I_start[i] = I_bar_l[i] + I_end[i-1];
        I_end[i] = I_start[i] + I_l[i];
    }
}